

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var Js::JavascriptArray::TemplatedIndexOfHelper<true,Js::TypedArrayBase,unsigned_int>
              (TypedArrayBase *pArr,Var search,uint fromIndex,uint toIndex,
              ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  JavascriptLibrary *pJVar7;
  JavascriptBoolean *pJVar8;
  JavascriptBoolean *pJVar9;
  uint local_6c;
  uint i;
  Var falseValue;
  Var trueValue;
  bool doUndefinedSearch;
  Var pvStack_50;
  bool isSearchTaggedInt;
  Var element;
  ScriptContext *scriptContext_local;
  uint toIndex_local;
  uint fromIndex_local;
  Var search_local;
  TypedArrayBase *pArr_local;
  Var local_20;
  TypeId local_18;
  TypeId local_14;
  RecyclableObject *pRStack_10;
  TypeId typeId;
  
  pvStack_50 = (Var)0x0;
  element = scriptContext;
  scriptContext_local._0_4_ = toIndex;
  scriptContext_local._4_4_ = fromIndex;
  _toIndex_local = search;
  search_local = pArr;
  bVar2 = TaggedInt::Is(search);
  local_20 = _toIndex_local;
  if (_toIndex_local == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  bVar3 = TaggedInt::Is(local_20);
  if (bVar3) {
    local_18 = TypeIds_FirstNumberType;
  }
  else {
    bVar3 = JavascriptNumber::Is_NoTaggedIntCheck(local_20);
    if (bVar3) {
      local_18 = TypeIds_Number;
    }
    else {
      pRStack_10 = UnsafeVarTo<Js::RecyclableObject>(local_20);
      if (pRStack_10 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      local_14 = RecyclableObject::GetTypeId(pRStack_10);
      if ((0x57 < (int)local_14) && (BVar5 = RecyclableObject::IsExternal(pRStack_10), BVar5 == 0))
      {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      local_18 = local_14;
    }
  }
  bVar3 = local_18 == TypeIds_Undefined;
  pJVar7 = ScriptContext::GetLibrary((ScriptContext *)element);
  pJVar8 = JavascriptLibraryBase::GetTrue(&pJVar7->super_JavascriptLibraryBase);
  pJVar7 = ScriptContext::GetLibrary((ScriptContext *)element);
  pJVar9 = JavascriptLibraryBase::GetFalse(&pJVar7->super_JavascriptLibraryBase);
  local_6c = scriptContext_local._4_4_;
  do {
    if ((uint)scriptContext_local <= local_6c) {
      return pJVar9;
    }
    BVar5 = TryTemplatedGetItem<Js::TypedArrayBase,unsigned_int>
                      ((RecyclableObject *)search_local,local_6c,&stack0xffffffffffffffb0,
                       (ScriptContext *)element,false);
    if (BVar5 == 0) {
      if (bVar3) {
        return pJVar8;
      }
    }
    else if ((bVar2) && (bVar4 = TaggedInt::Is(pvStack_50), bVar4)) {
      if (pvStack_50 == _toIndex_local) {
        return pJVar8;
      }
    }
    else {
      bVar4 = JavascriptConversion::SameValueZero(pvStack_50,_toIndex_local);
      if (bVar4) {
        return pJVar8;
      }
    }
    local_6c = local_6c + 1;
  } while( true );
}

Assistant:

Var JavascriptArray::TemplatedIndexOfHelper(T * pArr, Var search, P fromIndex, P toIndex, ScriptContext * scriptContext)
    {
        Var element = nullptr;
        bool isSearchTaggedInt = TaggedInt::Is(search);
        bool doUndefinedSearch = includesAlgorithm && JavascriptOperators::GetTypeId(search) == TypeIds_Undefined;

        Var trueValue = scriptContext->GetLibrary()->GetTrue();
        Var falseValue = scriptContext->GetLibrary()->GetFalse();

        //Consider: enumerating instead of walking all indices
        for (P i = fromIndex; i < toIndex; i++)
        {
            if (!TryTemplatedGetItem<T>(pArr, i, &element, scriptContext, !includesAlgorithm))
            {
                if (doUndefinedSearch)
                {
                    return trueValue;
                }
                continue;
            }

            if (isSearchTaggedInt && TaggedInt::Is(element))
            {
                if (element == search)
                {
                    return includesAlgorithm? trueValue : JavascriptNumber::ToVar(i, scriptContext);
                }
                continue;
            }

            if (includesAlgorithm)
            {
                //Array.prototype.includes
                if (JavascriptConversion::SameValueZero(element, search))
                {
                    return trueValue;
                }
            }
            else
            {
                //Array.prototype.indexOf
                if (JavascriptOperators::StrictEqual(element, search, scriptContext))
                {
                    return JavascriptNumber::ToVar(i, scriptContext);
                }
            }
        }

        return includesAlgorithm ? falseValue :  TaggedInt::ToVarUnchecked(-1);
    }